

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

void __thiscall icu_63::Package::addFile(Package *this,char *filesPath,char *name)

{
  char local_2d;
  int32_t local_2c;
  char type;
  uint8_t *puStack_28;
  int32_t length;
  uint8_t *data;
  char *name_local;
  char *filesPath_local;
  Package *this_local;
  
  data = (uint8_t *)name;
  name_local = filesPath;
  filesPath_local = this->inPkgName;
  puStack_28 = readFile(filesPath,name,&local_2c,&local_2d);
  addItem(this,(char *)data,puStack_28,local_2c,'\x01',local_2d);
  return;
}

Assistant:

void
Package::addFile(const char *filesPath, const char *name) {
    uint8_t *data;
    int32_t length;
    char type;

    data=readFile(filesPath, name, length, type);
    // readFile() exits the tool if it fails
    addItem(name, data, length, TRUE, type);
}